

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_kernel.cxx
# Opt level: O0

void __thiscall ExchCXX::XCKernel::XCKernel(XCKernel *this,libxc_name_string *xc_name,Spin polar)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  NamedType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ExchCXX::LibxcNameString>
  *in_RSI;
  XCKernel *in_RDI;
  Spin in_stack_00000084;
  string *in_stack_00000088;
  XCKernel *in_stack_ffffffffffffff98;
  string local_40 [64];
  
  pbVar1 = detail::
           NamedType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ExchCXX::LibxcNameString>
           ::get(in_RSI);
  std::__cxx11::string::string(local_40,(string *)pbVar1);
  libxc_kernel_factory(in_stack_00000088,in_stack_00000084);
  XCKernel(in_RDI,in_stack_ffffffffffffff98);
  ~XCKernel((XCKernel *)0x189be6);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

XCKernel::XCKernel(
  const libxc_name_string& xc_name,
  const Spin polar) :
XCKernel( libxc_kernel_factory( xc_name.get(), polar ) ) { }